

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_Deactivate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DObject *this;
  char *pcVar2;
  DObject *this_00;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004326bc;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004326a3:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004326bc:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1323,
                  "int AF_AActor_Deactivate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_0043264e;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004326bc;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_004326a3;
LAB_0043264e:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_004326db;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    this_00 = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (this_00 != (DObject *)0x0) {
        bVar1 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "activator == NULL || activator->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004326db;
        }
        goto LAB_00432690;
      }
    }
    else if (this_00 != (DObject *)0x0) goto LAB_004326ac;
    this_00 = (DObject *)0x0;
LAB_00432690:
    (*this->_vptr_DObject[0xe])(this,this_00);
    return 0;
  }
LAB_004326ac:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004326db:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1324,
                "int AF_AActor_Deactivate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Deactivate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(activator, AActor);
	self->Deactivate(activator);
	return 0;
}